

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O3

bool __thiscall OpenMD::SelectionCompiler::clauseIndex(SelectionCompiler *this)

{
  uint uVar1;
  pointer pTVar2;
  char *__s1;
  bool bVar3;
  int iVar4;
  uint *puVar5;
  type_info *ptVar6;
  undefined4 *puVar7;
  _func_void__Op_any_ptr__Arg_ptr *p_Var8;
  _Arg _Var9;
  any intVal;
  _Arg __arg;
  Token token;
  any local_80;
  Token local_70;
  _Arg local_58;
  _Storage local_50;
  Token local_48;
  Token local_30;
  
  tokenNext(&local_48,this);
  if (local_48.tok != 2) {
    bVar3 = numberExpected(this);
    goto LAB_0023535b;
  }
  puVar5 = (uint *)std::__any_caster<int>(&local_48.value);
  if (puVar5 == (uint *)0x0) {
    std::__throw_bad_any_cast();
  }
  uVar1 = *puVar5;
  pTVar2 = (this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->itokenInfix !=
       ((long)(this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) * -0x5555555555555555)
     && (pTVar2[this->itokenInfix].tok == 0x402)) {
    tokenNext(&local_30,this);
    if (local_30.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_30.value._M_manager)(_Op_destroy,&local_30.value,(_Arg *)0x0);
      local_30.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    pTVar2 = (this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->itokenInfix ==
         ((long)(this->atokenInfix).
                super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar2 >> 3) * -0x5555555555555555) ||
       (pTVar2[this->itokenInfix].tok != 2)) {
      bVar3 = numberExpected(this);
      goto LAB_0023535b;
    }
    tokenNext(&local_70,this);
    local_80._M_storage._M_ptr = (void *)0x0;
    if (local_70.value._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      local_80._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    else {
      local_58._M_obj = &local_80;
      (*local_70.value._M_manager)(_Op_xfer,&local_70.value,&local_58);
      if (local_70.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        (*local_70.value._M_manager)(_Op_destroy,&local_70.value,(_Arg *)0x0);
      }
    }
    ptVar6 = std::any::type(&local_80);
    __s1 = *(char **)(ptVar6 + 8);
    if ((__s1 == _put) || ((*__s1 != '*' && (iVar4 = strcmp(__s1,_put), iVar4 == 0)))) {
      puVar7 = (undefined4 *)std::__any_caster<int>(&local_80);
      if (puVar7 == (undefined4 *)0x0) {
        std::__throw_bad_any_cast();
      }
      local_70.value._M_storage._4_4_ = *puVar7;
      local_70.value._M_storage._0_4_ = uVar1;
      local_58._M_obj = std::any::_Manager_internal<std::pair<int,_int>_>::_S_manage;
      local_70.tok = 0x10400;
      local_70.intValue = 0;
      local_70.value._M_manager = std::any::_Manager_internal<std::pair<int,_int>_>::_S_manage;
      local_50 = local_70.value._M_storage;
      std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                (&this->ltokenPostfix,&local_70);
      _Var9 = (_Arg)std::any::_Manager_internal<std::pair<int,_int>_>::_S_manage;
      if (local_70.value._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
LAB_00235443:
        (*(code *)_Var9)(3,&local_58,0);
      }
      else {
        (*local_70.value._M_manager)(_Op_destroy,&local_70.value,(_Arg *)0x0);
        local_70.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        _Var9 = local_58;
        if ((any *)local_58._M_obj != (any *)0x0) goto LAB_00235443;
      }
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    if (local_80._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_80._M_manager)(_Op_destroy,&local_80,(_Arg *)0x0);
    }
    goto LAB_0023535b;
  }
  local_80._M_manager = std::any::_Manager_internal<int>::_S_manage;
  local_80._M_storage._4_4_ = 0;
  local_80._M_storage._0_4_ = uVar1;
  local_70.tok = 0x10400;
  local_70.intValue = 0;
  local_70.value._M_storage._4_4_ = 0;
  local_70.value._M_storage._0_4_ = uVar1;
  local_70.value._M_manager = std::any::_Manager_internal<int>::_S_manage;
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
            (&this->ltokenPostfix,&local_70);
  p_Var8 = std::any::_Manager_internal<int>::_S_manage;
  if (local_70.value._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
LAB_0023534a:
    (*p_Var8)(_Op_destroy,&local_80,(_Arg *)0x0);
  }
  else {
    (*local_70.value._M_manager)(_Op_destroy,&local_70.value,(_Arg *)0x0);
    local_70.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    p_Var8 = local_80._M_manager;
    if (local_80._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) goto LAB_0023534a;
  }
  bVar3 = true;
LAB_0023535b:
  if (local_48.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_48.value._M_manager)(_Op_destroy,&local_48.value,(_Arg *)0x0);
  }
  return bVar3;
}

Assistant:

bool SelectionCompiler::clauseIndex() {
    Token token = tokenNext();
    if (token.tok == Token::integer) {
      int index = std::any_cast<int>(token.value);
      int tok   = tokPeek();
      if (tok == Token::to) {
        tokenNext();
        tok = tokPeek();
        if (tok != Token::integer) { return numberExpected(); }

        std::any intVal = tokenNext().value;
        int first       = index;
        if (intVal.type() != typeid(int)) { return false; }
        int second = std::any_cast<int>(intVal);

        return addTokenToPostfix(
            Token(Token::index, std::any(std::make_pair(first, second))));

      } else {
        return addTokenToPostfix(Token(Token::index, std::any(index)));
      }
    } else {
      return numberExpected();
    }
  }